

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * google::protobuf::Arena::CopyConstruct<google::protobuf::EnumDescriptorProto>
                 (Arena *arena,void *from)

{
  undefined8 local_28;
  void *mem;
  void *from_local;
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    local_28 = (EnumDescriptorProto *)operator_new(0x70);
  }
  else {
    local_28 = (EnumDescriptorProto *)AllocateAligned(arena,0x70,8);
  }
  EnumDescriptorProto::EnumDescriptorProto(local_28,arena,(EnumDescriptorProto *)from);
  return local_28;
}

Assistant:

PROTOBUF_NOINLINE void* Arena::CopyConstruct(Arena* arena, const void* from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}